

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void do_complete(connectdata *conn)

{
  int local_14;
  connectdata *conn_local;
  
  (conn->data->req).chunk = false;
  if (conn->writesockfd < conn->sockfd) {
    local_14 = conn->sockfd;
  }
  else {
    local_14 = conn->writesockfd;
  }
  (conn->data->req).maxfd = local_14 + 1;
  Curl_pgrsTime(conn->data,TIMER_PRETRANSFER);
  return;
}

Assistant:

static void do_complete(struct connectdata *conn)
{
  conn->data->req.chunk=FALSE;
  conn->data->req.maxfd = (conn->sockfd>conn->writesockfd?
                           conn->sockfd:conn->writesockfd)+1;
  Curl_pgrsTime(conn->data, TIMER_PRETRANSFER);
}